

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_cse_conv(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  TRef TVar3;
  IRIns *pIVar4;
  IRIns *ir;
  IRRef ref;
  uint8_t guard;
  IRRef op2;
  IRRef op1;
  jit_State *J_local;
  
  if ((J->flags & 0x20000) != 0) {
    uVar2 = (uint)(J->fold).ins.field_0.op1;
    uVar1 = J->chain[0x5b];
    while (ir._0_4_ = (uint)uVar1, uVar2 < (uint)ir) {
      pIVar4 = (J->cur).ir + (uint)ir;
      if ((((pIVar4->field_0).op1 == uVar2) &&
          (((pIVar4->field_0).op2 & 0xfff) == ((J->fold).ins.field_0.op2 & 0xfff))) &&
         (((J->fold).ins.field_1.t.irt & 0x80) <= ((pIVar4->field_1).t.irt & 0x80))) {
        return (uint)ir;
      }
      uVar1 = (pIVar4->field_0).prev;
    }
  }
  TVar3 = lj_ir_emit(J);
  return TVar3;
}

Assistant:

LJFOLD(CONV any any)
LJFOLDF(cse_conv)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef op1 = fins->op1, op2 = (fins->op2 & IRCONV_MODEMASK);
    uint8_t guard = irt_isguard(fins->t);
    IRRef ref = J->chain[IR_CONV];
    while (ref > op1) {
      IRIns *ir = IR(ref);
      /* Commoning with stronger checks is ok. */
      if (ir->op1 == op1 && (ir->op2 & IRCONV_MODEMASK) == op2 &&
	  irt_isguard(ir->t) >= guard)
	return ref;
      ref = ir->prev;
    }
  }
  return EMITFOLD;  /* No fallthrough to regular CSE. */
}